

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void concept_suite::bidirectional_iterator_post_decrementable(void)

{
  size_type *this;
  initializer_list<int> __l;
  bool bVar1;
  iterator begin;
  iterator end;
  iterator first;
  size_type length;
  iterator local_d0;
  iterator local_c0;
  undefined1 local_b0 [8];
  iterator b;
  iterator a;
  undefined1 local_78 [8];
  circular_view<int,_18446744073709551615UL> span;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> data;
  
  local_40[0] = 0xb;
  local_40[1] = 0x16;
  local_40[2] = 0x21;
  local_40[3] = 0x2c;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  begin = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  end = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_20);
  first = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_20);
  length = std::vector<int,_std::allocator<int>_>::size
                     ((vector<int,_std::allocator<int>_> *)local_20);
  vista::circular_view<int,18446744073709551615ul>::
  circular_view<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((circular_view<int,18446744073709551615ul> *)local_78,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)end._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)first._M_current,
             length);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::begin
                 ((circular_view<int,_18446744073709551615UL> *)local_78);
  this = &b.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
            ((basic_iterator<int> *)this);
  _local_b0 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator--
                        ((basic_iterator<int> *)this,0);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator==
                    ((basic_iterator<int> *)this,&local_c0);
  boost::detail::test_impl
            ("a == span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xa7,"void concept_suite::bidirectional_iterator_post_decrementable()",bVar1);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_78);
  bVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator!=
                    ((basic_iterator<int> *)local_b0,&local_d0);
  boost::detail::test_impl
            ("b != span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0xa8,"void concept_suite::bidirectional_iterator_post_decrementable()",bVar1);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

void bidirectional_iterator_post_decrementable()
{
    std::vector<int> data = { 11, 22, 33, 44 };
    circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::iterator a = span.begin();
    ++a;
    circular_view<int>::iterator b = a--;
    BOOST_TEST(a == span.begin());
    BOOST_TEST(b != span.begin());
}